

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexes.cpp
# Opt level: O2

uint256 * jbcoin::getSignerListIndex(uint256 *__return_storage_ptr__,AccountID *account)

{
  uint *in_R8;
  undefined2 local_e;
  uint32_t local_c;
  
  local_e = 0x53;
  local_c = 0;
  sha512Half<unsigned_short,jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>,unsigned_int>
            (__return_storage_ptr__,(jbcoin *)&local_e,(unsigned_short *)account,
             (base_uint<160UL,_jbcoin::detail::AccountIDTag> *)&stack0xfffffffffffffff4,in_R8);
  return __return_storage_ptr__;
}

Assistant:

uint256
getSignerListIndex (AccountID const& account)
{
    // We are prepared for there to be multiple SignerLists in the future,
    // but we don't have them yet.  In anticipation of multiple SignerLists
    // We supply a 32-bit ID to locate the SignerList.  Until we actually
    // *have* multiple signer lists, we can default that ID to zero.
    return sha512Half(
        std::uint16_t(spaceSignerList),
        account,
        std::uint32_t (0));  // 0 == default SignerList ID.
}